

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lode_png_test_bitreader(uchar *data,size_t size,size_t numsteps,size_t *steps,uint *result)

{
  ulong nbits;
  uint uVar1;
  size_t sVar2;
  LodePNGBitReader reader;
  
  reader.bitsize = size * 8;
  if (reader.bitsize < 0xffffffffffffffc0 && size >> 0x3d == 0) {
    reader.bp = 0;
    reader.buffer = 0;
    reader.data = data;
    reader.size = size;
    for (sVar2 = 0; numsteps != sVar2; sVar2 = sVar2 + 1) {
      nbits = steps[sVar2];
      if (nbits < 0x1a) {
        if (nbits < 0x12) {
          if (nbits < 10) {
            uVar1 = ensureBits9(&reader,nbits);
          }
          else {
            uVar1 = ensureBits17(&reader,nbits);
          }
        }
        else {
          uVar1 = ensureBits25(&reader,nbits);
        }
      }
      else {
        uVar1 = ensureBits32(&reader,nbits);
      }
      if (uVar1 == 0) goto LAB_001169c0;
      uVar1 = ~(-1 << ((byte)nbits & 0x1f)) & reader.buffer;
      reader.buffer = reader.buffer >> ((byte)nbits & 0x1f);
      reader.bp = reader.bp + nbits;
      result[sVar2] = uVar1;
    }
    uVar1 = 1;
  }
  else {
LAB_001169c0:
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

unsigned lode_png_test_bitreader(const unsigned char* data, size_t size,
                                 size_t numsteps, const size_t* steps, unsigned* result) {
  size_t i;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, data, size);
  if(error) return 0;
  for(i = 0; i < numsteps; i++) {
    size_t step = steps[i];
    unsigned ok;
    if(step > 25) ok = ensureBits32(&reader, step);
    else if(step > 17) ok = ensureBits25(&reader, step);
    else if(step > 9) ok = ensureBits17(&reader, step);
    else ok = ensureBits9(&reader, step);
    if(!ok) return 0;
    result[i] = readBits(&reader, step);
  }
  return 1;
}